

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall IteratorTest::comparisonOperators<false>(IteratorTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_12;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_14;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_15;
  difference_type dVar1;
  difference_type dVar2;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar3;
  reference piVar4;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar5;
  reference piVar6;
  int iVar7;
  bool bVar8;
  iterator local_1d0;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it1;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it2;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it1,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it2,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it1);
  }
  dVar1 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
  local_1d0.view_._0_1_ = dVar1 == 0x18;
  test((bool *)&local_1d0);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it2);
  }
  dVar1 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
  local_1d0.view_._0_1_ = dVar1 == 0;
  test((bool *)&local_1d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it1,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it2,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it2);
  }
  dVar1 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
  local_1d0.view_._0_1_ = dVar1 == -0x18;
  test((bool *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  }
  dVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  local_1d0.view_._0_1_ = dVar2 == 0x18;
  test((bool *)&local_1d0);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  dVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  local_1d0.view_._0_1_ = dVar2 == 0;
  test((bool *)&local_1d0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  dVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  local_1d0.view_._0_1_ = dVar2 == -0x18;
  test((bool *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  *shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  }
  dVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  local_1d0.view_._0_1_ = dVar2 == 0x18;
  test((bool *)&local_1d0);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  dVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  local_1d0.view_._0_1_ = dVar2 == 0;
  test((bool *)&local_1d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  dVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator-
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  local_1d0.view_._0_1_ = dVar2 == -0x18;
  test((bool *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  *shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it1,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it2,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it1);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it2);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end(&local_1d0,&v);
  bVar8 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&local_1d0);
  if (bVar8) {
    andres::View<int,_false,_std::allocator<unsigned_long>_>::end((iterator *)&shape,&v);
    shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it2,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  }
  else {
    shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_4);
  if (bVar8) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar3 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it1);
  piVar4 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar3);
  if (*piVar4 == 0x2e) {
    pIVar3 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it2);
    piVar4 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar3);
    local_1d0.view_._0_1_ = *piVar4 == 0x2e;
  }
  else {
    local_1d0.view_._0_1_ = false;
  }
  test((bool *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_4,1,(allocator_type *)&v);
  begin_15._M_current._1_7_ =
       shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_15._M_current._0_1_ =
       shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_15._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_15,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  bVar8 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  if (bVar8) {
    andres::View<int,_true,_std::allocator<unsigned_long>_>::end
              ((const_iterator *)&shape_2,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
    shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it2,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&shape_2);
  }
  else {
    shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_5);
  if (bVar8) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar5);
  if (*piVar6 == 0x2e) {
    pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar5);
    local_1d0.view_._0_1_ = *piVar6 == 0x2e;
  }
  else {
    local_1d0.view_._0_1_ = false;
  }
  test((bool *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_4,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_4);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_4,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_4);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
  iVar7 = 0x18;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end(&local_1d0,&v);
  bVar8 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,&local_1d0);
  if (bVar8) {
    andres::View<int,_false,_std::allocator<unsigned_long>_>::end((iterator *)&shape_4,&v);
    shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it2,
                    (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_4);
  }
  else {
    shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_8);
  if (bVar8) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar5);
  if (*piVar6 == 0x2e) {
    pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar5);
    local_1d0.view_._0_1_ = *piVar6 == 0x2e;
  }
  else {
    local_1d0.view_._0_1_ = false;
  }
  test((bool *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_00._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it1,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it2,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator!=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_01._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator!=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_8,1,(allocator_type *)&v);
  begin_10._M_current._1_7_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_10._M_current._0_1_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_10._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_10,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator!=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_02._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it1,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it2,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it2);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator<
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it1);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_03._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_03._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_8,1,(allocator_type *)&v);
  begin_11._M_current._1_7_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_11._M_current._0_1_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_11._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_11,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_04._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it1,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it2,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator>
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_05._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_8,1,(allocator_type *)&v);
  begin_12._M_current._1_7_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_12._M_current._0_1_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_12._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_12,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_06._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_06._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it1,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it2,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it2);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it1);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_07._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_07._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_8,1,(allocator_type *)&v);
  begin_13._M_current._1_7_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_13._M_current._0_1_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_13._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_13,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator<=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_08._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_08._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_08._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it1,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_1d0,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it2,&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,false,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,false,std::allocator<unsigned_long>> *)&it1,&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_5,1,(allocator_type *)&v);
  begin_09._M_current._1_7_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_09._M_current._0_1_ =
       shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_09._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_1d0,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_8,1,(allocator_type *)&v);
  begin_14._M_current._1_7_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_14._M_current._0_1_ =
       shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_14._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_14,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape_5,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape_5);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_1d0.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  iVar7 = 0x17;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it1);
    local_1d0.view_._0_1_ =
         andres::Iterator<int,true,std::allocator<unsigned_long>>::operator>=
                   ((Iterator<int,true,std::allocator<unsigned_long>> *)&it1,
                    (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
    test((bool *)&local_1d0);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it2);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it2.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void IteratorTest::comparisonOperators(){
    // operator-
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    // operator==
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    //operator!=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    //operator<
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    //operator>
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    //operator<=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    //operator>=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
}